

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

pos_t check_line_directive_args(c2m_ctx_t c2m_ctx,VARR_token_t *buffer)

{
  c2m_ctx_t pcVar1;
  char cVar2;
  short sVar3;
  token_t *pptVar4;
  token_t ptVar5;
  VARR_char *pVVar6;
  undefined8 *puVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  int *piVar13;
  ulong uVar14;
  c2m_ctx_t extraout_RAX;
  size_t sVar15;
  ulong uVar16;
  char *pcVar17;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  char *extraout_RAX_02;
  undefined4 extraout_var;
  undefined4 *puVar18;
  c2m_ctx_t extraout_RAX_03;
  c2m_ctx_t extraout_RAX_04;
  ulong uVar19;
  size_t sVar20;
  node_t pnVar21;
  ulong uVar22;
  ulong *extraout_RDX;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar23;
  c2m_ctx_t extraout_RDX_06;
  c2m_ctx_t extraout_RDX_07;
  c2m_ctx_t extraout_RDX_08;
  c2m_ctx_t pcVar24;
  c2m_ctx_t extraout_RDX_09;
  c2m_ctx_t unaff_RBX;
  VARR_char *unaff_RBP;
  c2mir_options *pcVar25;
  c2m_ctx_t tree;
  node_t_conflict pnVar26;
  c2m_ctx_t c2m_ctx_00;
  c2m_ctx_t unaff_R12;
  c2m_ctx_t pcVar27;
  size_t unaff_R13;
  c2m_ctx_t pcVar28;
  VARR_char *unaff_R14;
  anon_union_8_2_027a474d_for_u aVar29;
  size_t unaff_R15;
  char *pcVar30;
  char *pcVar31;
  c2m_ctx_t pcVar32;
  bool bVar33;
  pos_t pVar34;
  pos_t pVar35;
  pos_t pVar36;
  pos_t pVar37;
  pos_t pVar38;
  pos_t pVar39;
  val vVar40;
  pos_t pVar41;
  pos_t pVar42;
  val vStack_188;
  val vStack_178;
  char *pcStack_168;
  c2m_ctx_t pcStack_160;
  c2m_ctx_t pcStack_158;
  c2m_ctx_t pcStack_150;
  c2m_ctx_t pcStack_148;
  c2m_ctx_t pcStack_138;
  c2m_ctx_t pcStack_130;
  c2m_ctx_t pcStack_128;
  c2mir_options *pcStack_120;
  node_t pnStack_118;
  macro_t pmStack_110;
  macro mStack_108;
  c2m_ctx_t pcStack_e8;
  c2m_ctx_t pcStack_e0;
  size_t sStack_d8;
  VARR_char *pVStack_d0;
  size_t sStack_c8;
  VARR_char *pVStack_c0;
  c2m_ctx_t pcStack_b0;
  c2m_ctx_t pcStack_a8;
  size_t sStack_a0;
  VARR_char *pVStack_98;
  size_t sStack_90;
  VARR_char *pVStack_88;
  c2m_ctx_t pcStack_80;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  
  if (buffer != (VARR_token_t *)0x0) {
    uVar16 = buffer->els_num;
    if (uVar16 != 0) {
      pptVar4 = buffer->varr;
      sVar3 = *(short *)*pptVar4;
      uVar19 = (ulong)(sVar3 == 0x20);
      if ((uVar19 < uVar16) && (ptVar5 = pptVar4[uVar19], *(short *)ptVar5 == 0x100)) {
        pcVar17 = (ptVar5->pos).fname;
        pcVar31 = ptVar5->repr;
        pcVar12 = pcVar31;
        do {
          cVar2 = *pcVar12;
          pcVar12 = pcVar12 + 1;
        } while ((byte)(cVar2 - 0x30U) < 10);
        if (cVar2 == '\0') {
          piVar13 = __errno_location();
          *piVar13 = 0;
          uVar14 = strtoll(pcVar31,(char **)0x0,10);
          if ((*piVar13 != 0) || (uVar14 >> 0x1f != 0)) {
            ptVar5 = pptVar4[uVar19];
            uVar23._0_4_ = (ptVar5->pos).lno;
            uVar23._4_4_ = (ptVar5->pos).ln_pos;
            error(c2m_ctx,0x1c3510,(ptVar5->pos).fname,uVar23,ptVar5->repr);
          }
          uVar19 = (ulong)(sVar3 == 0x20) + 1;
          if (uVar19 < uVar16) {
            uVar19 = uVar19 + (*(short *)pptVar4[uVar19] == 0x20);
          }
          if ((uVar19 < uVar16) && (*(short *)pptVar4[uVar19] == 0x102)) {
            pcVar17 = (pptVar4[uVar19]->node->u).s.s;
            uVar19 = uVar19 + 1;
          }
          pcVar31 = (char *)0x0;
          if (uVar19 == uVar16) {
            pcVar31 = pcVar17;
          }
          uVar22 = 0xffffffffffffffff;
          if (uVar19 == uVar16) {
            uVar22 = uVar14 & 0xffffffff;
          }
          goto LAB_00194d48;
        }
      }
    }
    pcVar31 = (char *)0x0;
    uVar22 = 0xffffffffffffffff;
LAB_00194d48:
    pVar42.lno = (int)uVar22;
    pVar42.ln_pos = (int)(uVar22 >> 0x20);
    pVar42.fname = pcVar31;
    return pVar42;
  }
  check_line_directive_args_cold_1();
  pVVar6 = c2m_ctx->temp_string;
  tree = (c2m_ctx_t)buffer;
  c2m_ctx_00 = c2m_ctx;
  sVar15 = unaff_R15;
  pcStack_80 = extraout_RAX;
  if (pVVar6 == (VARR_char *)0x0) {
LAB_00194f2e:
    pVStack_88 = (VARR_char *)0x194f33;
    add_to_temp_string_cold_4();
LAB_00194f33:
    pVStack_88 = (VARR_char *)0x194f38;
    add_to_temp_string_cold_3();
  }
  else {
    unaff_R12 = (c2m_ctx_t)buffer;
    if (pVVar6->els_num == 0) {
LAB_00194e58:
      pVStack_88 = (VARR_char *)0x194e60;
      sVar15 = strlen((char *)buffer);
      if (sVar15 != 0) {
        unaff_R13 = 0;
        pcStack_80 = c2m_ctx;
        do {
          unaff_RBP = c2m_ctx->temp_string;
          c2m_ctx_00 = (c2m_ctx_t)unaff_RBP->varr;
          if (c2m_ctx_00 == (c2m_ctx_t)0x0) {
            pVStack_88 = (VARR_char *)0x194f2e;
            add_to_temp_string_cold_2();
            unaff_RBX = c2m_ctx;
            goto LAB_00194f2e;
          }
          cVar2 = *(char *)((long)((c2m_ctx_t)buffer)->env[0].__jmpbuf + (unaff_R13 - 0x10));
          unaff_R14 = (VARR_char *)CONCAT71((int7)((ulong)unaff_R14 >> 8),cVar2);
          uVar16 = unaff_RBP->els_num + 1;
          if (unaff_RBP->size < uVar16) {
            pcVar27 = (c2m_ctx_t)((uVar16 >> 1) + uVar16);
            pVStack_88 = (VARR_char *)0x194ea8;
            tree = pcVar27;
            pcVar17 = (char *)realloc(c2m_ctx_00,(size_t)pcVar27);
            unaff_RBP->varr = pcVar17;
            unaff_RBP->size = (size_t)pcVar27;
            c2m_ctx = pcStack_80;
          }
          sVar20 = unaff_RBP->els_num;
          unaff_RBP->els_num = sVar20 + 1;
          unaff_RBP->varr[sVar20] = cVar2;
          unaff_R13 = unaff_R13 + 1;
          unaff_R15 = sVar15;
        } while (sVar15 != unaff_R13);
      }
      unaff_R14 = c2m_ctx->temp_string;
      c2m_ctx_00 = (c2m_ctx_t)unaff_R14->varr;
      unaff_RBX = c2m_ctx;
      sVar15 = unaff_R15;
      if (c2m_ctx_00 != (c2m_ctx_t)0x0) {
        uVar16 = unaff_R14->els_num + 1;
        if (unaff_R14->size < uVar16) {
          sVar15 = (uVar16 >> 1) + uVar16;
          pVStack_88 = (VARR_char *)0x194f00;
          pcVar17 = (char *)realloc(c2m_ctx_00,sVar15);
          unaff_R14->varr = pcVar17;
          unaff_R14->size = sVar15;
        }
        pcVar17 = (char *)unaff_R14->els_num;
        unaff_R14->els_num = (size_t)(pcVar17 + 1);
        unaff_R14->varr[(long)pcVar17] = '\0';
        pVar34._8_8_ = pcVar17 + 1;
        pVar34.fname = pcVar17;
        return pVar34;
      }
      goto LAB_00194f33;
    }
    unaff_RBX = c2m_ctx;
    if (pVVar6->varr != (char *)0x0) {
      sVar20 = pVVar6->els_num - 1;
      if (pVVar6->varr[sVar20] == '\0') {
        pVVar6->els_num = sVar20;
      }
      goto LAB_00194e58;
    }
  }
  pVStack_88 = (VARR_char *)check_pragma;
  add_to_temp_string_cold_1();
  pcStack_b0 = unaff_RBX;
  pcStack_a8 = unaff_R12;
  sStack_a0 = unaff_R13;
  pVStack_98 = unaff_R14;
  sStack_90 = sVar15;
  pVStack_88 = unaff_RBP;
  if (extraout_RDX == (ulong *)0x0) {
    pVStack_c0 = (VARR_char *)replace_defined;
    check_pragma_cold_1();
    pcStack_130 = c2m_ctx_00;
    pcStack_e8 = unaff_RBX;
    pcStack_e0 = unaff_R12;
    sStack_d8 = unaff_R13;
    pVStack_d0 = unaff_R14;
    sStack_c8 = sVar15;
    pVStack_c0 = unaff_RBP;
    if (tree != (c2m_ctx_t)0x0) {
      pcVar27 = (c2m_ctx_t)c2m_ctx_00->pre_ctx;
      pcVar32 = (c2m_ctx_t)&DAT_00000001;
      iVar9 = 0;
      pcVar24 = extraout_RDX_06;
      pcStack_138 = tree;
      pcStack_128 = pcVar27;
      do {
        pcVar1 = (c2m_ctx_t)((long)&pcVar32[-1].gen_ctx + 7);
        pcVar28 = (c2m_ctx_t)tree->ctx;
        if (pcVar28 <= pcVar1) goto LAB_001953d8;
        pnVar21 = (node_t)tree->env[0].__jmpbuf[0];
        if (pnVar21 == (node_t)0x0) {
          pcStack_148 = (c2m_ctx_t)0x1953ec;
          replace_defined_cold_3();
          pcVar17 = (char *)0x0;
LAB_001953ec:
          pcStack_148 = (c2m_ctx_t)0x1953f1;
          replace_defined_cold_2();
          pcVar27 = c2m_ctx_00;
          c2m_ctx_00 = pcVar28;
LAB_001953f1:
          pcStack_148 = (c2m_ctx_t)eval;
          replace_defined_cold_1();
          pcStack_168 = pcVar17;
          pcStack_160 = unaff_R12;
          pcStack_158 = c2m_ctx_00;
          pcStack_150 = pcVar1;
          pcStack_148 = pcVar32;
          switch(*(node_code_t *)&tree->ctx) {
          case N_IGNORE:
            pVar42 = get_node_pos(pcVar27,(node_t_conflict)tree);
            pcVar17 = (char *)0x0;
            error(pcVar27,0x1c3235,pVar42.fname,pVar42._8_8_);
            aVar29.i_val = 0;
            goto LAB_00195790;
          case N_I:
          case N_L:
          case N_LL:
            aVar29 = (anon_union_8_2_027a474d_for_u)
                     ((anon_union_8_2_027a474d_for_u *)(tree->env[0].__jmpbuf + 2))->i_val;
            break;
          case N_U:
          case N_UL:
          case N_ULL:
          case N_CH16:
          case N_CH32:
            aVar29 = (anon_union_8_2_027a474d_for_u)
                     ((anon_union_8_2_027a474d_for_u *)(tree->env[0].__jmpbuf + 2))->i_val;
            pcVar17 = &DAT_00000001;
            goto LAB_00195790;
          default:
            __assert_fail("FALSE",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0xddc,"struct val eval(c2m_ctx_t, node_t)");
          case N_CH:
            aVar29 = (anon_union_8_2_027a474d_for_u)(long)*(char *)(tree->env[0].__jmpbuf + 2);
            break;
          case N_ANDAND:
          case N_OROR:
            vVar40 = eval(pcVar27,(node_t_conflict)tree->env[0].__jmpbuf[2]);
            vStack_188.u = vVar40.u;
            vStack_188.uns_p = vVar40.uns_p;
            bVar33 = vStack_188.u.i_val != 0;
            if (*(node_code_t *)&tree->ctx == N_ANDAND) {
              if (vStack_188.u.i_val == 0) {
                bVar33 = false;
              }
              else {
LAB_00195765:
                pnVar26 = (node_t_conflict)tree->env[0].__jmpbuf[2];
                if (pnVar26 != (node_t_conflict)0x0) {
                  pnVar26 = (pnVar26->op_link).next;
                }
                vVar40 = eval(pcVar27,pnVar26);
                bVar33 = vVar40.u.i_val != 0;
              }
            }
            else if (vStack_188.u.i_val == 0) goto LAB_00195765;
            aVar29.i_val._1_7_ = 0;
            aVar29.i_val._0_1_ = bVar33;
            break;
          case N_EQ:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            bVar33 = vStack_188.u.i_val == vStack_178.u.i_val;
            goto LAB_0019555d;
          case N_NE:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            aVar29.i_val._1_7_ = 0;
            aVar29.i_val._0_1_ = vStack_188.u.i_val != vStack_178.u.i_val;
            goto LAB_00195790;
          case N_LT:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            if (uVar11 != 0) {
              aVar29.i_val._1_7_ = 0;
              aVar29.i_val._0_1_ = vStack_188.u.u_val < vStack_178.u.u_val;
              goto LAB_00195790;
            }
            aVar29.i_val._1_7_ = 0;
            aVar29.i_val._0_1_ = vStack_188.u.i_val < vStack_178.u.i_val;
            break;
          case N_LE:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            if (uVar11 != 0) {
              aVar29.i_val._1_7_ = 0;
              aVar29.i_val._0_1_ = vStack_188.u.u_val <= vStack_178.u.u_val;
              goto LAB_00195790;
            }
            aVar29.i_val._1_7_ = 0;
            aVar29.i_val._0_1_ = vStack_188.u.i_val <= vStack_178.u.i_val;
            break;
          case N_GT:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            if (uVar11 != 0) {
              aVar29.i_val._1_7_ = 0;
              aVar29.i_val._0_1_ = vStack_178.u.u_val < vStack_188.u.u_val;
              goto LAB_00195790;
            }
            aVar29.i_val._1_7_ = 0;
            aVar29.i_val._0_1_ = vStack_178.u.i_val < vStack_188.u.i_val;
            break;
          case N_GE:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            if (uVar11 != 0) {
              aVar29.i_val._1_7_ = 0;
              aVar29.i_val._0_1_ = vStack_178.u.u_val <= vStack_188.u.u_val;
              goto LAB_00195790;
            }
            aVar29.i_val._1_7_ = 0;
            aVar29.i_val._0_1_ = vStack_178.u.i_val <= vStack_188.u.i_val;
            break;
          case N_BITWISE_NOT:
            vVar40 = eval(pcVar27,(node_t_conflict)tree->env[0].__jmpbuf[2]);
            pcVar17 = (char *)(ulong)(uint)vVar40.uns_p;
            aVar29.u_val = ~vVar40.u.u_val;
            goto LAB_00195790;
          case N_NOT:
            vVar40 = eval(pcVar27,(node_t_conflict)tree->env[0].__jmpbuf[2]);
            uVar11 = vVar40.uns_p;
            bVar33 = vVar40.u.i_val == 0;
LAB_0019555d:
            pcVar17 = (char *)(ulong)uVar11;
            aVar29.i_val._1_7_ = 0;
            aVar29.i_val._0_1_ = bVar33;
            goto LAB_00195790;
          case N_AND:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            aVar29.u_val = vStack_178.u.u_val & vStack_188.u.u_val;
            goto LAB_00195790;
          case N_OR:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            aVar29.u_val = vStack_178.u.u_val | vStack_188.u.u_val;
            goto LAB_00195790;
          case N_XOR:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            aVar29.u_val = vStack_178.u.u_val ^ vStack_188.u.u_val;
            goto LAB_00195790;
          case N_LSH:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            aVar29.u_val = vStack_188.u.u_val << (vStack_178.u.u_val & 0x3f);
            goto LAB_00195790;
          case N_RSH:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            if (uVar11 != 0) {
              aVar29.u_val = vStack_188.u.u_val >> (vStack_178.u.u_val & 0x3f);
              goto LAB_00195790;
            }
            aVar29.i_val = vStack_188.u.i_val >> (vStack_178.u.u_val & 0x3f);
            break;
          case N_ADD:
            pnVar26 = (node_t_conflict)tree->env[0].__jmpbuf[2];
            if ((pnVar26 == (node_t_conflict)0x0) || ((pnVar26->op_link).next == (node_t)0x0)) {
              vVar40 = eval(pcVar27,pnVar26);
              aVar29 = vVar40.u;
              pcVar17 = (char *)(ulong)(uint)vVar40.uns_p;
            }
            else {
              uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
              pcVar17 = (char *)(ulong)uVar11;
              aVar29.i_val = vStack_178.u.i_val + vStack_188.u.i_val;
            }
            goto LAB_00195790;
          case N_SUB:
            pnVar26 = (node_t_conflict)tree->env[0].__jmpbuf[2];
            if ((pnVar26 == (node_t_conflict)0x0) || ((pnVar26->op_link).next == (node_t)0x0)) {
              vVar40 = eval(pcVar27,pnVar26);
              pcVar17 = (char *)(ulong)(uint)vVar40.uns_p;
              aVar29.i_val = -vVar40.u.i_val;
            }
            else {
              uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
              pcVar17 = (char *)(ulong)uVar11;
              aVar29.i_val = vStack_188.u.i_val - vStack_178.u.i_val;
            }
            goto LAB_00195790;
          case N_MUL:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            aVar29.i_val = vStack_178.u.i_val * vStack_188.u.i_val;
            goto LAB_00195790;
          case N_DIV:
          case N_MOD:
            uVar11 = eval_binop_operands(pcVar27,(node_t_conflict)tree,&vStack_188,&vStack_178);
            pcVar17 = (char *)(ulong)uVar11;
            bVar33 = vStack_178.u.i_val == 0;
            if (uVar11 == 0) {
              if (vStack_178.u.i_val == 0) goto LAB_001958a7;
              aVar29.i_val = vStack_188.u.i_val % vStack_178.u.i_val;
              if (*(node_code_t *)&tree->ctx == N_DIV) {
                aVar29.i_val = vStack_188.u.i_val / vStack_178.u.i_val;
              }
              bVar33 = false;
            }
            else if (vStack_178.u.i_val == 0) {
LAB_001958a7:
              aVar29.i_val = 1;
            }
            else {
              bVar33 = false;
              aVar29.u_val = vStack_188.u.u_val % vStack_178.u.u_val;
              if (*(node_code_t *)&tree->ctx == N_DIV) {
                aVar29.u_val = vStack_188.u.u_val / vStack_178.u.u_val;
              }
            }
            if (bVar33) {
              pVar42 = get_node_pos(pcVar27,(node_t_conflict)tree);
              pcVar31 = "%";
              if (*(node_code_t *)&tree->ctx == N_DIV) {
                pcVar31 = "/";
              }
              error(pcVar27,0x1c3253,pVar42.fname,pVar42._8_8_,pcVar31);
            }
            goto LAB_00195790;
          case N_COND:
            vVar40 = eval(pcVar27,(node_t_conflict)tree->env[0].__jmpbuf[2]);
            vStack_188.u = vVar40.u;
            vStack_188.uns_p = vVar40.uns_p;
            pnVar26 = (node_t_conflict)tree->env[0].__jmpbuf[2];
            if (pnVar26 == (node_t_conflict)0x0) goto LAB_00195751;
            uVar11 = (uint)(vStack_188.u.i_val == 0);
            goto LAB_0019573e;
          }
          pcVar17 = (char *)0x0;
          goto LAB_00195790;
        }
        unaff_R12 = (c2m_ctx_t)(&pnVar21[1].attr)[(long)&pcVar32[-1].gen_ctx];
        if (*(undefined2 *)&unaff_R12->ctx == 0x103) {
          c2m_ctx_00 = (c2m_ctx_t)unaff_R12->env[0].__jmpbuf[3];
          pcStack_148 = (c2m_ctx_t)0x1951db;
          iVar10 = strcmp((char *)c2m_ctx_00,"defined");
          pcVar27 = (c2m_ctx_t)CONCAT44(extraout_var,iVar10);
          pcVar24 = extraout_RDX_07;
          tree = pcStack_138;
          if (iVar10 == 0) {
            pcVar24 = pcVar32;
            if ((pcVar32 < pcVar28) &&
               (pcVar27 = *(c2m_ctx_t *)(&pnVar21->code + (long)pcVar32 * 2),
               *(undefined2 *)&pcVar27->ctx == N_OR)) {
              pcVar24 = (c2m_ctx_t)((long)&pcVar32->ctx + 1);
            }
            if (pcVar24 < pcVar28) {
              pcVar27 = *(c2m_ctx_t *)(&pnVar21->code + (long)pcVar24 * 2);
              if (*(undefined2 *)&pcVar27->ctx == N_ADD) {
                pcVar27 = (c2m_ctx_t)((long)&pcVar24->ctx + 1);
                if ((pcVar27 < pcVar28) && (*(&pnVar21->attr)[(long)&pcVar24->ctx] == 0x20)) {
                  pcVar27 = (c2m_ctx_t)((long)&pcVar24->ctx + 2);
                  pcVar24 = pcVar27;
                }
                if ((pcVar27 < pcVar28) &&
                   (lVar8 = (long)pcVar27 * 2,
                   *(undefined2 *)&(*(c2m_ctx_t *)(&pnVar21->code + lVar8))->ctx == 0x103)) {
                  c2m_ctx_00 = (c2m_ctx_t)((long)&pcVar27->ctx + 1);
                  if ((c2m_ctx_00 < pcVar28) &&
                     (pcVar24 = (c2m_ctx_t)(&pnVar21->attr)[(long)&pcVar27->ctx],
                     *(undefined2 *)&pcVar24->ctx == N_OR)) {
                    pcVar27 = (c2m_ctx_t)((long)&pcVar27->ctx + 2);
                    c2m_ctx_00 = pcVar27;
                  }
                  if ((c2m_ctx_00 < pcVar28) &&
                     (pcVar27 = *(c2m_ctx_t *)(&pnVar21->code + (long)c2m_ctx_00 * 2),
                     *(undefined2 *)&pcVar27->ctx == N_ADD_ASSIGN)) {
                    pcStack_148 = (c2m_ctx_t)0x19535a;
                    mStack_108.id = (token_t)*(c2m_ctx_t *)(&pnVar21->code + lVar8);
                    iVar10 = HTAB_macro_t_do((HTAB_macro_t *)pcStack_128->env[0].__jmpbuf[0],
                                             &mStack_108,HTAB_FIND,&pmStack_110);
                    pcVar17 = "0";
                    if (iVar10 != 0) {
                      pcVar17 = "1";
                    }
                    pcStack_120 = unaff_R12->options;
                    pnStack_118 = (node_t)unaff_R12->env[0].__jmpbuf[0];
                    tree = (c2m_ctx_t)0x30;
                    pcStack_148 = (c2m_ctx_t)0x195388;
                    puVar18 = (undefined4 *)reg_malloc(pcStack_130,0x30);
                    *puVar18 = 0x100;
                    *(c2mir_options **)(puVar18 + 2) = pcStack_120;
                    *(node_t *)(puVar18 + 4) = pnStack_118;
                    *(char **)(puVar18 + 10) = pcVar17;
                    puVar18[6] = 0;
                    *(undefined8 *)(puVar18 + 8) = 0;
                    pnVar21 = (node_t)pcStack_138->env[0].__jmpbuf[0];
                    pcVar27 = pcStack_138;
                    if ((pnVar21 == (node_t)0x0) ||
                       (pcVar24 = c2m_ctx_00, (c2m_ctx_t)pcStack_138->ctx <= pcVar1))
                    goto LAB_001953f1;
                    goto LAB_001952b7;
                  }
                }
              }
              else if (*(undefined2 *)&pcVar27->ctx == 0x103) {
                pcStack_148 = (c2m_ctx_t)0x19524a;
                mStack_108.id = (token_t)pcVar27;
                iVar10 = HTAB_macro_t_do((HTAB_macro_t *)pcStack_128->env[0].__jmpbuf[0],&mStack_108
                                         ,HTAB_FIND,&pmStack_110);
                pcVar17 = "0";
                if (iVar10 != 0) {
                  pcVar17 = "1";
                }
                pcStack_120 = unaff_R12->options;
                pnStack_118 = (node_t)unaff_R12->env[0].__jmpbuf[0];
                tree = (c2m_ctx_t)0x30;
                pcStack_148 = (c2m_ctx_t)0x195278;
                puVar18 = (undefined4 *)reg_malloc(pcStack_130,0x30);
                *puVar18 = 0x100;
                *(c2mir_options **)(puVar18 + 2) = pcStack_120;
                *(node_t *)(puVar18 + 4) = pnStack_118;
                *(char **)(puVar18 + 10) = pcVar17;
                puVar18[6] = 0;
                *(undefined8 *)(puVar18 + 8) = 0;
                pnVar21 = (node_t)pcStack_138->env[0].__jmpbuf[0];
                c2m_ctx_00 = pcStack_138;
                pcVar28 = pcVar24;
                if ((pnVar21 == (node_t)0x0) || ((c2m_ctx_t)pcStack_138->ctx <= pcVar1))
                goto LAB_001953ec;
LAB_001952b7:
                *(undefined4 **)((long)pnVar21 + (long)pcVar32 * 8 + -8) = puVar18;
                pcStack_148 = (c2m_ctx_t)0x1952c9;
                c2m_ctx_00 = pcStack_138;
                del_tokens((VARR_token_t *)pcStack_138,(int)pcVar32,(int)pcVar24 + iVar9);
                pcVar27 = extraout_RAX_03;
                pcVar24 = extraout_RDX_08;
                tree = pcStack_138;
              }
            }
          }
        }
        pcVar32 = (c2m_ctx_t)((long)&pcVar32->ctx + 1);
        iVar9 = iVar9 + -1;
      } while (tree != (c2m_ctx_t)0x0);
    }
    pcStack_148 = (c2m_ctx_t)0x1953d8;
    replace_defined_cold_4();
    pcVar27 = extraout_RAX_04;
    pcVar24 = extraout_RDX_09;
LAB_001953d8:
    pVar39._8_8_ = pcVar24;
    pVar39.fname = (char *)pcVar27;
    return pVar39;
  }
  pcVar17 = (char *)*extraout_RDX;
  puVar7 = (undefined8 *)extraout_RDX[2];
  if (pcVar17 == (char *)0x0) {
    pcVar31 = (char *)0x0;
  }
  else {
    pcVar31 = (char *)(ulong)(*(short *)*puVar7 == 0x20);
  }
  if ((pcVar17 <= pcVar31) || (*(short *)puVar7[(long)pcVar31] != 0x103)) {
LAB_00194f9c:
    warning(c2m_ctx_00,0x1c3532,(char *)tree->options,(node_t)tree->env[0].__jmpbuf[0]);
    pVar35.lno = (int)extraout_RDX_00;
    pVar35.ln_pos = (int)((ulong)extraout_RDX_00 >> 0x20);
    pVar35.fname = extraout_RAX_00;
    return pVar35;
  }
  pVStack_c0 = (VARR_char *)0x194f98;
  iVar9 = strcmp(*(char **)((short *)puVar7[(long)pcVar31] + 0x14),"STDC");
  if (iVar9 != 0) goto LAB_00194f9c;
  pcVar12 = pcVar31 + 1;
  if ((pcVar12 < pcVar17) && (*(short *)puVar7[(long)(pcVar31 + 1)] == 0x20)) {
    pcVar12 = (char *)((ulong)pcVar31 | 2);
  }
  if ((pcVar12 < pcVar17) && (*(short *)puVar7[(long)pcVar12] == 0x103)) {
    pcVar31 = *(char **)((short *)puVar7[(long)pcVar12] + 0x14);
    pVStack_c0 = (VARR_char *)0x195001;
    iVar9 = strcmp(pcVar31,"FP_CONTRACT");
    if (iVar9 != 0) {
      pVStack_c0 = (VARR_char *)0x195014;
      iVar9 = strcmp(pcVar31,"FENV_ACCESS");
      if (iVar9 != 0) {
        pVStack_c0 = (VARR_char *)0x195027;
        iVar9 = strcmp(pcVar31,"CX_LIMITED_RANGE");
        if (iVar9 != 0) {
          pcVar25 = tree->options;
          pnVar21 = (node_t)tree->env[0].__jmpbuf[0];
          pcVar17 = "unknown STDC pragma %s";
          goto LAB_00195040;
        }
      }
    }
    pcVar30 = pcVar12 + 1;
    if ((pcVar30 < pcVar17) && (*(short *)puVar7[(long)(pcVar12 + 1)] == 0x20)) {
      pcVar30 = pcVar12 + 2;
    }
    if ((pcVar30 < pcVar17) && (*(short *)puVar7[(long)pcVar30] == 0x103)) {
      pcVar31 = *(char **)((short *)puVar7[(long)pcVar30] + 0x14);
      pVStack_c0 = (VARR_char *)0x1950ba;
      iVar9 = strcmp(pcVar31,"ON");
      uVar23 = extraout_RDX_03;
      if (iVar9 != 0) {
        pVStack_c0 = (VARR_char *)0x1950cd;
        iVar9 = strcmp(pcVar31,"OFF");
        uVar23 = extraout_RDX_04;
        if (iVar9 != 0) {
          pVStack_c0 = (VARR_char *)0x1950e0;
          iVar9 = strcmp(pcVar31,"DEFAULT");
          uVar23 = extraout_RDX_05;
          if (iVar9 != 0) {
            pcVar25 = tree->options;
            pnVar21 = (node_t)tree->env[0].__jmpbuf[0];
            pcVar17 = "unknown STDC pragma value";
LAB_00195040:
            error(c2m_ctx_00,pcVar17,(char *)pcVar25,pnVar21,pcVar31);
            pVar36.lno = (int)extraout_RDX_01;
            pVar36.ln_pos = (int)((ulong)extraout_RDX_01 >> 0x20);
            pVar36.fname = extraout_RAX_01;
            return pVar36;
          }
        }
      }
      pcVar31 = pcVar30 + 1;
      if ((pcVar31 < pcVar17) &&
         ((*(short *)puVar7[(long)(pcVar30 + 1)] == 0x20 ||
          (*(short *)puVar7[(long)(pcVar30 + 1)] == 10)))) {
        pcVar31 = pcVar30 + 2;
      }
      if (pcVar17 <= pcVar31) {
        pVar38.lno = (int)uVar23;
        pVar38.ln_pos = (int)((ulong)uVar23 >> 0x20);
        pVar38.fname = pcVar31;
        return pVar38;
      }
      pcVar25 = tree->options;
      pnVar21 = (node_t)tree->env[0].__jmpbuf[0];
      pcVar17 = "garbage at STDC pragma end";
    }
    else {
      pcVar25 = tree->options;
      pnVar21 = (node_t)tree->env[0].__jmpbuf[0];
      pcVar17 = "wrong STDC pragma value";
    }
  }
  else {
    pcVar25 = tree->options;
    pnVar21 = (node_t)tree->env[0].__jmpbuf[0];
    pcVar17 = "wrong STDC pragma";
  }
  error(c2m_ctx_00,pcVar17,(char *)pcVar25,pnVar21);
  pVar37.lno = (int)extraout_RDX_02;
  pVar37.ln_pos = (int)((ulong)extraout_RDX_02 >> 0x20);
  pVar37.fname = extraout_RAX_02;
  return pVar37;
  while (bVar33) {
LAB_0019573e:
    pnVar26 = (pnVar26->op_link).next;
    bVar33 = uVar11 != 0;
    uVar11 = uVar11 - 1;
    if (pnVar26 == (node_t)0x0) break;
  }
LAB_00195751:
  vVar40 = eval(pcVar27,pnVar26);
  aVar29 = vVar40.u;
  pcVar17 = (char *)(ulong)(uint)vVar40.uns_p;
LAB_00195790:
  pVar41.lno = aVar29._0_4_;
  pVar41.ln_pos = aVar29._4_4_;
  pVar41.fname = pcVar17;
  return pVar41;
}

Assistant:

static pos_t check_line_directive_args (c2m_ctx_t c2m_ctx, VARR (token_t) * buffer) {
  size_t i, len = VARR_LENGTH (token_t, buffer);
  token_t *buffer_arr = VARR_ADDR (token_t, buffer);
  const char *fname;
  pos_t pos;
  int lno;
  unsigned long long l;

  if (len == 0) return no_pos;
  i = buffer_arr[0]->code == ' ' ? 1 : 0;
  fname = buffer_arr[i]->pos.fname;
  if (i >= len || buffer_arr[i]->code != T_NUMBER) return no_pos;
  if (!digits_p (buffer_arr[i]->repr)) return no_pos;
  errno = 0;
  l = strtoll (buffer_arr[i]->repr, NULL, 10);
  lno = (int) l;
  if (errno || l > ((1ul << 31) - 1))
    error (c2m_ctx, buffer_arr[i]->pos, "#line with too big value: %s", buffer_arr[i]->repr);
  i++;
  if (i < len && buffer_arr[i]->code == ' ') i++;
  if (i < len && buffer_arr[i]->code == T_STR) {
    fname = buffer_arr[i]->node->u.s.s;
    i++;
  }
  if (i == len) {
    pos.fname = fname;
    pos.lno = lno;
    pos.ln_pos = 0;
    return pos;
  }
  return no_pos;
}